

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprite.cpp
# Opt level: O0

void __thiscall sf::Sprite::setTexture(Sprite *this,Texture *texture,bool resetRect)

{
  Vector2u VVar1;
  bool local_59;
  bool local_4d;
  uint uStack_48;
  uint local_44;
  Rect<int> local_3c;
  Rect<int> local_2c;
  undefined1 local_19;
  Texture *pTStack_18;
  bool resetRect_local;
  Texture *texture_local;
  Sprite *this_local;
  
  local_4d = true;
  local_19 = resetRect;
  pTStack_18 = texture;
  texture_local = (Texture *)this;
  if (!resetRect) {
    local_59 = false;
    if (this->m_texture == (Texture *)0x0) {
      Rect<int>::Rect(&local_2c);
      local_59 = sf::operator==(&this->m_textureRect,&local_2c);
    }
    local_4d = local_59;
  }
  if (local_4d != false) {
    VVar1 = Texture::getSize(pTStack_18);
    local_44 = VVar1.x;
    VVar1 = Texture::getSize(pTStack_18);
    uStack_48 = VVar1.y;
    Rect<int>::Rect(&local_3c,0,0,local_44,uStack_48);
    setTextureRect(this,&local_3c);
  }
  this->m_texture = pTStack_18;
  return;
}

Assistant:

void Sprite::setTexture(const Texture& texture, bool resetRect)
{
    // Recompute the texture area if requested, or if there was no valid texture & rect before
    if (resetRect || (!m_texture && (m_textureRect == sf::IntRect())))
        setTextureRect(IntRect(0, 0, texture.getSize().x, texture.getSize().y));

    // Assign the new texture
    m_texture = &texture;
}